

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc.cpp
# Opt level: O1

bool any_arg_contains(QList<FunctionDef> *functions,QByteArray *pattern)

{
  long lVar1;
  char *pcVar2;
  qsizetype qVar3;
  ArgumentDef *pAVar4;
  FunctionDef *pFVar5;
  long lVar6;
  long lVar7;
  FunctionDef *f;
  FunctionDef *pFVar8;
  bool bVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QByteArrayView QVar13;
  bool local_41;
  
  lVar1 = (functions->d).size;
  local_41 = lVar1 != 0;
  if (local_41) {
    pFVar8 = (functions->d).ptr;
    pFVar5 = pFVar8 + lVar1;
    pcVar2 = (pattern->d).ptr;
    qVar3 = (pattern->d).size;
    do {
      lVar1 = (pFVar8->arguments).d.size;
      bVar9 = lVar1 == 0;
      if (!bVar9) {
        pAVar4 = (pFVar8->arguments).d.ptr;
        QVar10.m_data = (pAVar4->normalizedType).d.ptr;
        QVar10.m_size = (pAVar4->normalizedType).d.size;
        QVar12.m_data = pcVar2;
        QVar12.m_size = qVar3;
        lVar6 = QtPrivate::findByteArray(QVar10,0,QVar12);
        if (lVar6 == -1) {
          lVar6 = 0;
          do {
            bVar9 = lVar1 * 0xa8 + -0xa8 == lVar6;
            if (bVar9) goto LAB_00122cc3;
            QVar11.m_data = *(storage_type **)((long)&pAVar4[1].normalizedType.d.ptr + lVar6);
            QVar11.m_size = *(qsizetype *)((long)&pAVar4[1].normalizedType.d.size + lVar6);
            QVar13.m_data = pcVar2;
            QVar13.m_size = qVar3;
            lVar7 = QtPrivate::findByteArray(QVar11,0,QVar13);
            lVar6 = lVar6 + 0xa8;
          } while (lVar7 == -1);
        }
        if (!bVar9) {
          return local_41;
        }
      }
LAB_00122cc3:
      pFVar8 = pFVar8 + 1;
      local_41 = pFVar8 != pFVar5;
    } while (local_41);
  }
  return local_41;
}

Assistant:

Type Moc::parseType()
{
    Type type;
    bool hasSignedOrUnsigned = false;
    bool isVoid = false;
    type.firstToken = lookup();
    for (;;) {
        skipCxxAttributes();
        switch (next()) {
            case SIGNED:
            case UNSIGNED:
                hasSignedOrUnsigned = true;
                Q_FALLTHROUGH();
            case CONST:
            case VOLATILE:
                type.name += lexem();
                type.name += ' ';
                if (lookup(0) == VOLATILE)
                    type.isVolatile = true;
                continue;
            case Q_MOC_COMPAT_TOKEN:
            case Q_INVOKABLE_TOKEN:
            case Q_SCRIPTABLE_TOKEN:
            case Q_SIGNALS_TOKEN:
            case Q_SLOTS_TOKEN:
            case Q_SIGNAL_TOKEN:
            case Q_SLOT_TOKEN:
                type.name += lexem();
                return type;
            case NOTOKEN:
                return type;
            default:
                prev();
                break;
        }
        break;
    }

    skipCxxAttributes();
    if (test(ENUM))
        type.typeTag = TypeTag::HasEnum;
    if (test(CLASS))
        type.typeTag |= TypeTag::HasClass;
    if (test(STRUCT))
        type.typeTag |= TypeTag::HasStruct;
    for(;;) {
        skipCxxAttributes();
        switch (next()) {
        case IDENTIFIER:
            // void mySlot(unsigned myArg)
            if (hasSignedOrUnsigned) {
                prev();
                break;
            }
            Q_FALLTHROUGH();
        case CHAR:
        case SHORT:
        case INT:
        case LONG:
            type.name += lexem();
            // preserve '[unsigned] long long', 'short int', 'long int', 'long double'
            if (test(LONG) || test(INT) || test(DOUBLE)) {
                type.name += ' ';
                prev();
                continue;
            }
            break;
        case FLOAT:
        case DOUBLE:
        case VOID:
        case BOOL:
        case AUTO:
            type.name += lexem();
            isVoid |= (lookup(0) == VOID);
            break;
        case NOTOKEN:
            return type;
        default:
            prev();
            ;
        }
        if (test(LANGLE)) {
            if (type.name.isEmpty()) {
                // '<' cannot start a type
                return type;
            }
            type.name += lexemUntil(RANGLE);
        }
        if (test(SCOPE)) {
            type.name += lexem();
            type.isScoped = true;
        } else {
            break;
        }
    }
    while (test(CONST) || test(VOLATILE) || test(SIGNED) || test(UNSIGNED)
           || test(STAR) || test(AND) || test(ANDAND)) {
        type.name += ' ';
        type.name += lexem();
        if (lookup(0) == AND)
            type.referenceType = Type::Reference;
        else if (lookup(0) == ANDAND)
            type.referenceType = Type::RValueReference;
        else if (lookup(0) == STAR)
            type.referenceType = Type::Pointer;
    }
    type.rawName = type.name;
    // transform stupid things like 'const void' or 'void const' into 'void'
    if (isVoid && type.referenceType == Type::NoReference) {
        type.name = "void";
    }
    return type;
}